

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool operator_null_cmp(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_value_t value;
  gravity_value_t value_00;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  if ((args->isa == gravity_class_null) && ((args->field_1).n == 1)) {
    if ((args[1].isa == gravity_class_null) && (args[1].field_1.n == 1)) {
      value_00.field_1.n = 1;
      value_00.isa = gravity_class_bool;
      gravity_vm_setslot(vm,value_00,rindex);
      vm_local._7_1_ = true;
    }
    else {
      value.field_1.n = 0;
      value.isa = gravity_class_bool;
      gravity_vm_setslot(vm,value,rindex);
      vm_local._7_1_ = true;
    }
  }
  else {
    args->isa = gravity_class_int;
    (args->field_1).n = 0;
    vm_local._7_1_ = operator_int_cmp(vm,args,nargs,rindex);
  }
  return vm_local._7_1_;
}

Assistant:

static bool operator_null_cmp (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm,nargs)
    if (VALUE_ISA_UNDEFINED(args[0])) {
        // undefined case (undefined is equal ONLY to undefined)
        if (VALUE_ISA_UNDEFINED(args[1])) RETURN_VALUE(VALUE_FROM_BOOL(1), rindex);
        RETURN_VALUE(VALUE_FROM_BOOL(0), rindex);
    }

    args[0] = VALUE_FROM_INT(0);
    return operator_int_cmp(vm, args, nargs, rindex);
}